

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O3

void __thiscall testing::internal::PrintTo(internal *this,__uint128_t v,ostream *os)

{
  int iVar1;
  bool bVar2;
  size_t sVar3;
  uint uVar4;
  ostream *in_RDX;
  ostream *poVar5;
  byte *__s;
  byte local_12 [2];
  
  if (this == (internal *)0x0 && os == (ostream *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(in_RDX,"0",1);
    return;
  }
  __s = local_12 + 1;
  local_12[1] = 0;
  if (this != (internal *)0x0 || os != (ostream *)0x0) {
    do {
      do {
        poVar5 = (ostream *)((ulong)os / 10);
        iVar1 = (int)this + (int)((ulong)this / 10) * -10 + (int)((ulong)os % 10) * 6;
        uVar4 = (iVar1 * 0xcd & 0xffffU) >> 0xb;
        this = (internal *)((ulong)uVar4 + ((ulong)os % 10) * 0x1999999999999999 + (ulong)this / 10)
        ;
        __s[-1] = (char)iVar1 + (char)uVar4 * -10 | 0x30;
        __s = __s + -1;
        bVar2 = (ostream *)&DAT_00000009 < os;
        os = poVar5;
      } while (bVar2);
    } while (this != (internal *)0x0);
  }
  sVar3 = strlen((char *)__s);
  std::__ostream_insert<char,std::char_traits<char>>(in_RDX,(char *)__s,sVar3);
  return;
}

Assistant:

void PrintTo(__uint128_t v, ::std::ostream* os) {
  if (v == 0) {
    *os << "0";
    return;
  }

  // Buffer large enough for ceil(log10(2^128))==39 and the null terminator
  char buf[40];
  char* p = buf + sizeof(buf);

  // Some configurations have a __uint128_t, but no support for built in
  // division. Do manual long division instead.

  uint64_t high = static_cast<uint64_t>(v >> 64);
  uint64_t low = static_cast<uint64_t>(v);

  *--p = 0;
  while (high != 0 || low != 0) {
    uint64_t high_mod = high % 10;
    high = high / 10;
    // This is the long division algorithm specialized for a divisor of 10 and
    // only two elements.
    // Notable values:
    //   2^64 / 10 == 1844674407370955161
    //   2^64 % 10 == 6
    const uint64_t carry = 6 * high_mod + low % 10;
    low = low / 10 + high_mod * 1844674407370955161 + carry / 10;

    char digit = static_cast<char>(carry % 10);
    *--p = static_cast<char>('0' + digit);
  }
  *os << p;
}